

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_qnames(lysp_ctx *ctx,lysp_stmt *stmt,lysp_qname **qnames,yang_arg arg,
                       lysp_ext_instance **exts)

{
  long *plVar1;
  lysp_qname *plVar2;
  lysp_stmt *stmt_00;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 in_register_0000000c;
  uint64_t insubstmt_index;
  ly_ctx *plVar8;
  lysp_stmt **pplVar9;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  plVar2 = *qnames;
  if (plVar2 == (lysp_qname *)0x0) {
    plVar4 = (long *)malloc(0x20);
    if (plVar4 == (long *)0x0) goto LAB_00167988;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    lVar5 = *(long *)&plVar2[-1].flags;
    *(long *)&plVar2[-1].flags = lVar5 + 1;
    plVar4 = (long *)realloc(&plVar2[-1].flags,lVar5 * 0x18 + 0x20);
    if (plVar4 == (long *)0x0) {
      *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + -1;
LAB_00167988:
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_qnames");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *qnames = (lysp_qname *)(plVar4 + 1);
  plVar1 = plVar4 + lVar5 * 3;
  plVar1[-2] = 0;
  plVar1[-1] = 0;
  *plVar1 = 0;
  if (ctx == (lysp_ctx *)0x0) {
    plVar8 = (ly_ctx *)0x0;
  }
  else {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar3 = lydict_insert(plVar8,stmt->arg,0,(char **)(plVar1 + -2));
  if (LVar3 == LY_SUCCESS) {
    plVar4[lVar5 * 3 + -1] = (long)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    pplVar9 = &stmt->child;
    do {
      stmt_00 = *pplVar9;
      if (stmt_00 == (lysp_stmt *)0x0) {
        return LY_SUCCESS;
      }
      if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = lyplg_ext_stmt2str(stmt_00->kw);
        pcVar7 = lyplg_ext_stmt2str(stmt->kw);
        ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
                pcVar6,pcVar7);
        return LY_EVALID;
      }
      insubstmt_index = 0xffffffffffffffff;
      if (*qnames != (lysp_qname *)0x0) {
        insubstmt_index = *(long *)&(*qnames)[-1].flags - 1;
      }
      LVar3 = lysp_stmt_ext(ctx,stmt_00,stmt->kw,insubstmt_index,
                            (lysp_ext_instance **)CONCAT44(in_register_0000000c,arg));
      pplVar9 = &stmt_00->next;
    } while (LVar3 == LY_SUCCESS);
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_qnames(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    struct lysp_qname *item;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, arg, stmt->arg));

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &item->str));
    item->mod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}